

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util_test.cc
# Opt level: O0

void anon_unknown.dwarf_3336::Test_TemplateTestUtilTest_GetFilename::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  int iVar3;
  char *pcVar4;
  TemplateDictionaryPeer local_100;
  TemplateDictionaryPeer child_peer;
  TemplateDictionaryPeer parent_peer;
  size_t sStack_e8;
  undefined8 local_e0;
  TemplateId TStack_d8;
  TemplateString local_c0;
  TemplateDictionary *local_a0;
  TemplateDictionary *child;
  TemplateDictionary local_78 [8];
  TemplateDictionary parent;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&child,"test_GetFilename");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_78,(TemplateString *)&child,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_c0,"INCLUDE_marker");
  TVar1.length_ = local_c0.length_;
  TVar1.ptr_ = local_c0.ptr_;
  TVar1.is_immutable_ = local_c0.is_immutable_;
  TVar1._17_7_ = local_c0._17_7_;
  TVar1.id_ = local_c0.id_;
  local_a0 = (TemplateDictionary *)ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
  ctemplate::TemplateString::TemplateString((TemplateString *)&parent_peer,"included_filename");
  TVar2.length_ = sStack_e8;
  TVar2.ptr_ = (char *)parent_peer.dict_;
  TVar2._16_8_ = local_e0;
  TVar2.id_ = TStack_d8;
  ctemplate::TemplateDictionary::SetFilename(TVar2);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&child_peer,local_78);
  pcVar4 = ctemplate::TemplateDictionaryPeer::GetFilename(&child_peer);
  if (pcVar4 != (char *)0x0) {
    fprintf(_stderr,"Check failed: %s %s %s\n","__null","==","parent_peer.GetFilename()");
    exit(1);
  }
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_100,local_a0);
  pcVar4 = ctemplate::TemplateDictionaryPeer::GetFilename(&local_100);
  iVar3 = strcmp("included_filename",pcVar4);
  if (iVar3 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(\"included_filename\", child_peer.GetFilename()) == 0");
    exit(1);
  }
  ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
  return;
}

Assistant:

TEST(TemplateTestUtilTest, GetFilename) {
  TemplateDictionary parent("test_GetFilename");
  TemplateDictionary* child = parent.AddIncludeDictionary("INCLUDE_marker");
  child->SetFilename("included_filename");

  TemplateDictionaryPeer parent_peer(&parent);
  EXPECT_EQ(NULL, parent_peer.GetFilename());

  TemplateDictionaryPeer child_peer(child);
  EXPECT_STREQ("included_filename", child_peer.GetFilename());
}